

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O1

bool __thiscall CFG::anon_unknown_11::Optimizer::IsEmpty(Optimizer *this,Expression *Code)

{
  char cVar1;
  Block *pBVar2;
  bool bVar3;
  Block *pBVar4;
  byte unaff_R15B;
  
  cVar1 = *(char *)&(this->super_RelooperRecursor).Parent;
  bVar3 = true;
  if (cVar1 != '\x16') {
    if (cVar1 == '\x01') {
      pBVar2 = this[2].Entry;
      unaff_R15B = pBVar2 == (Block *)0x0;
      if (!(bool)unaff_R15B) {
        pBVar4 = (Block *)0x0;
        do {
          if (this[2].Entry <= pBVar4) {
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          bVar3 = IsEmpty((Optimizer *)
                          (&(this[2].super_RelooperRecursor.Parent)->Module)[(long)pBVar4],Code);
          if (!bVar3) break;
          pBVar4 = (Block *)((long)&pBVar4->relooper + 1);
          unaff_R15B = pBVar2 == pBVar4;
        } while (!(bool)unaff_R15B);
      }
    }
    bVar3 = (bool)(cVar1 == '\x01' & unaff_R15B);
  }
  return bVar3;
}

Assistant:

bool IsEmpty(wasm::Expression* Code) {
    if (Code->is<wasm::Nop>()) {
      return true; // a nop
    }
    if (auto* WasmBlock = Code->dynCast<wasm::Block>()) {
      for (auto* Item : WasmBlock->list) {
        if (!IsEmpty(Item)) {
          return false;
        }
      }
      return true; // block with no non-empty contents
    }
    return false;
  }